

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_misc.c
# Opt level: O0

int lj_cf_misc_sysprof_start(lua_State *L)

{
  int iVar1;
  char *err_details;
  luam_Sysprof_Options opt;
  luam_Sysprof_Options *in_stack_00000030;
  int status;
  luam_Sysprof_Options *opt_00;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  lua_State *in_stack_ffffffffffffffc8;
  int local_4;
  
  memset(&stack0xffffffffffffffc0,0,0x28);
  opt_00 = (luam_Sysprof_Options *)0x0;
  iVar1 = parse_sysprof_opts(L,in_stack_00000030,(char **)opt.ctx);
  if (iVar1 == 0) {
    iVar1 = luaM_sysprof_start((lua_State *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),opt_00)
    ;
    if (iVar1 == 0) {
      lua_pushboolean((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (int)((ulong)opt_00 >> 0x20));
      local_4 = 1;
    }
    else {
      local_4 = prof_error(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)opt_00);
    }
  }
  else {
    local_4 = prof_error(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)opt_00);
  }
  return local_4;
}

Assistant:

LJLIB_CF(misc_sysprof_start)
{
#if !LJ_HASSYSPROF
  const char *err_details = err2msg(LJ_ERR_PROF_DETAILS_DISABLED);
  return prof_error(L, PROFILE_ERRUSE, err_details);
#else
  int status = PROFILE_SUCCESS;

  struct luam_Sysprof_Options opt = {};
  const char *err_details = NULL;

  status = parse_sysprof_opts(L, &opt, &err_details);
  if (LJ_UNLIKELY(status != PROFILE_SUCCESS))
    return prof_error(L, status, err_details);

  status = luaM_sysprof_start(L, &opt);
  if (LJ_UNLIKELY(status != PROFILE_SUCCESS))
    /* Allocated memory will be freed in on_stop callback. */
    return prof_error(L, status, err_details);

  lua_pushboolean(L, 1);
  return 1;
#endif /* !LJ_HASSYSPROF */
}